

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extrapolation.cc
# Opt level: O0

extrapolation_t *
tchecker::zg::extrapolation_factory
          (extrapolation_type_t extrapolation_type,clockbounds_t *clock_bounds)

{
  local_extra_lu_t *plVar1;
  local_extra_lu_plus_t *this;
  invalid_argument *this_00;
  undefined1 local_e0 [47];
  undefined1 local_b1;
  undefined1 local_b0 [47];
  undefined1 local_81;
  undefined1 local_80 [47];
  undefined1 local_51;
  undefined1 local_50 [48];
  clockbounds_t *local_20;
  clockbounds_t *clock_bounds_local;
  local_extra_lu_t *plStack_10;
  extrapolation_type_t extrapolation_type_local;
  
  local_20 = clock_bounds;
  clock_bounds_local._4_4_ = extrapolation_type;
  if (extrapolation_type == NO_EXTRAPOLATION) {
    plVar1 = (local_extra_lu_t *)operator_new(8);
    no_extrapolation_t::no_extrapolation_t((no_extrapolation_t *)plVar1);
    plStack_10 = plVar1;
  }
  else {
    switch(extrapolation_type) {
    case EXTRA_LU_GLOBAL:
      plVar1 = (local_extra_lu_t *)operator_new(0x18);
      local_50[0x13] = 1;
      clockbounds::clockbounds_t::global_lu_map((clockbounds_t *)(local_50 + 0x20));
      global_extra_lu_t::global_lu_extrapolation_t
                ((global_extra_lu_t *)plVar1,
                 (shared_ptr<const_tchecker::clockbounds::global_lu_map_t> *)(local_50 + 0x20));
      local_50[0x13] = 0;
      plStack_10 = plVar1;
      std::shared_ptr<const_tchecker::clockbounds::global_lu_map_t>::~shared_ptr
                ((shared_ptr<const_tchecker::clockbounds::global_lu_map_t> *)(local_50 + 0x20));
      break;
    case EXTRA_LU_LOCAL:
      plVar1 = (local_extra_lu_t *)operator_new(0x28);
      local_51 = 1;
      clockbounds::clockbounds_t::local_lu_map((clockbounds_t *)local_50);
      local_extra_lu_t::local_lu_extrapolation_t
                (plVar1,(shared_ptr<const_tchecker::clockbounds::local_lu_map_t> *)local_50);
      local_51 = 0;
      plStack_10 = plVar1;
      std::shared_ptr<const_tchecker::clockbounds::local_lu_map_t>::~shared_ptr
                ((shared_ptr<const_tchecker::clockbounds::local_lu_map_t> *)local_50);
      break;
    case EXTRA_LU_PLUS_GLOBAL:
      plVar1 = (local_extra_lu_t *)operator_new(0x18);
      local_80[0x17] = 1;
      clockbounds::clockbounds_t::global_lu_map((clockbounds_t *)(local_80 + 0x18));
      global_extra_lu_plus_t::global_lu_extrapolation_t
                ((global_extra_lu_plus_t *)plVar1,
                 (shared_ptr<const_tchecker::clockbounds::global_lu_map_t> *)(local_80 + 0x18));
      local_80[0x17] = 0;
      plStack_10 = plVar1;
      std::shared_ptr<const_tchecker::clockbounds::global_lu_map_t>::~shared_ptr
                ((shared_ptr<const_tchecker::clockbounds::global_lu_map_t> *)(local_80 + 0x18));
      break;
    case EXTRA_LU_PLUS_LOCAL:
      this = (local_extra_lu_plus_t *)operator_new(0x28);
      local_81 = 1;
      clockbounds::clockbounds_t::local_lu_map((clockbounds_t *)local_80);
      local_extra_lu_plus_t::local_lu_extrapolation_t
                (this,(shared_ptr<const_tchecker::clockbounds::local_lu_map_t> *)local_80);
      local_81 = 0;
      plStack_10 = (local_extra_lu_t *)this;
      std::shared_ptr<const_tchecker::clockbounds::local_lu_map_t>::~shared_ptr
                ((shared_ptr<const_tchecker::clockbounds::local_lu_map_t> *)local_80);
      break;
    case EXTRA_M_GLOBAL:
      plVar1 = (local_extra_lu_t *)operator_new(0x18);
      local_b0[0x17] = 1;
      clockbounds::clockbounds_t::global_m_map((clockbounds_t *)(local_b0 + 0x18));
      global_extra_m_t::global_m_extrapolation_t
                ((global_extra_m_t *)plVar1,
                 (shared_ptr<const_tchecker::clockbounds::global_m_map_t> *)(local_b0 + 0x18));
      local_b0[0x17] = 0;
      plStack_10 = plVar1;
      std::shared_ptr<const_tchecker::clockbounds::global_m_map_t>::~shared_ptr
                ((shared_ptr<const_tchecker::clockbounds::global_m_map_t> *)(local_b0 + 0x18));
      break;
    case EXTRA_M_LOCAL:
      plVar1 = (local_extra_lu_t *)operator_new(0x20);
      local_b1 = 1;
      clockbounds::clockbounds_t::local_m_map((clockbounds_t *)local_b0);
      local_extra_m_t::local_m_extrapolation_t
                ((local_extra_m_t *)plVar1,
                 (shared_ptr<const_tchecker::clockbounds::local_m_map_t> *)local_b0);
      local_b1 = 0;
      plStack_10 = plVar1;
      std::shared_ptr<const_tchecker::clockbounds::local_m_map_t>::~shared_ptr
                ((shared_ptr<const_tchecker::clockbounds::local_m_map_t> *)local_b0);
      break;
    case EXTRA_M_PLUS_GLOBAL:
      plVar1 = (local_extra_lu_t *)operator_new(0x18);
      local_e0[0x17] = 1;
      clockbounds::clockbounds_t::global_m_map((clockbounds_t *)(local_e0 + 0x18));
      global_extra_m_plus_t::global_m_extrapolation_t
                ((global_extra_m_plus_t *)plVar1,
                 (shared_ptr<const_tchecker::clockbounds::global_m_map_t> *)(local_e0 + 0x18));
      local_e0[0x17] = 0;
      plStack_10 = plVar1;
      std::shared_ptr<const_tchecker::clockbounds::global_m_map_t>::~shared_ptr
                ((shared_ptr<const_tchecker::clockbounds::global_m_map_t> *)(local_e0 + 0x18));
      break;
    case EXTRA_M_PLUS_LOCAL:
      plVar1 = (local_extra_lu_t *)operator_new(0x20);
      clockbounds::clockbounds_t::local_m_map((clockbounds_t *)local_e0);
      local_extra_m_plus_t::local_m_extrapolation_t
                ((local_extra_m_plus_t *)plVar1,
                 (shared_ptr<const_tchecker::clockbounds::local_m_map_t> *)local_e0);
      plStack_10 = plVar1;
      std::shared_ptr<const_tchecker::clockbounds::local_m_map_t>::~shared_ptr
                ((shared_ptr<const_tchecker::clockbounds::local_m_map_t> *)local_e0);
      break;
    default:
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Unknown zone extrapolation");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  return (extrapolation_t *)plStack_10;
}

Assistant:

tchecker::zg::extrapolation_t * extrapolation_factory(enum extrapolation_type_t extrapolation_type,
                                                      tchecker::clockbounds::clockbounds_t const & clock_bounds)
{
  if (extrapolation_type == tchecker::zg::NO_EXTRAPOLATION)
    return new tchecker::zg::no_extrapolation_t;
  switch (extrapolation_type) {
  case tchecker::zg::EXTRA_LU_GLOBAL:
    return new tchecker::zg::global_extra_lu_t{clock_bounds.global_lu_map()};
  case tchecker::zg::EXTRA_LU_LOCAL:
    return new tchecker::zg::local_extra_lu_t{clock_bounds.local_lu_map()};
  case tchecker::zg::EXTRA_LU_PLUS_GLOBAL:
    return new tchecker::zg::global_extra_lu_plus_t{clock_bounds.global_lu_map()};
  case tchecker::zg::EXTRA_LU_PLUS_LOCAL:
    return new tchecker::zg::local_extra_lu_plus_t{clock_bounds.local_lu_map()};
  case tchecker::zg::EXTRA_M_GLOBAL:
    return new tchecker::zg::global_extra_m_t{clock_bounds.global_m_map()};
  case tchecker::zg::EXTRA_M_LOCAL:
    return new tchecker::zg::local_extra_m_t{clock_bounds.local_m_map()};
  case tchecker::zg::EXTRA_M_PLUS_GLOBAL:
    return new tchecker::zg::global_extra_m_plus_t{clock_bounds.global_m_map()};
  case tchecker::zg::EXTRA_M_PLUS_LOCAL:
    return new tchecker::zg::local_extra_m_plus_t{clock_bounds.local_m_map()};
  default:
    throw std::invalid_argument("Unknown zone extrapolation");
  }
}